

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  unsigned_long uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  StringEntry *pSVar5;
  StringEntry *pSVar6;
  size_type sVar7;
  ostream *poVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  ulong local_350;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  string local_2f8 [32];
  cmSystemToolsRPathInfo rp [2];
  ostringstream e;
  byte abStack_210 [480];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar4 = 0xa0;
  paVar10 = &rp[0].Name.field_2;
  do {
    (((string *)(paVar10 + -1))->_M_dataplus)._M_p = (pointer)paVar10;
    *(size_type *)((long)paVar10 + -8) = 0;
    paVar10->_M_local_buf[0] = '\0';
    paVar10[1]._M_allocated_capacity = (size_type)(paVar10 + 2);
    *(undefined8 *)((long)paVar10 + 0x18) = 0;
    paVar10[2]._M_local_buf[0] = 0;
    paVar10 = paVar10 + 5;
    lVar4 = lVar4 + -0x50;
  } while (lVar4 != 0);
  cmELF::cmELF(&elf,(file->_M_dataplus)._M_p);
  se[0] = (StringEntry *)0x0;
  se[1] = (StringEntry *)0x0;
  se_name[0] = (char *)0x0;
  se_name[1] = (char *)0x0;
  pSVar5 = cmELF::GetRPath(&elf);
  if (pSVar5 != (StringEntry *)0x0) {
    se_name[0] = "RPATH";
    se[0] = pSVar5;
  }
  uVar12 = (uint)(pSVar5 != (StringEntry *)0x0);
  pSVar6 = cmELF::GetRunPath(&elf);
  if (pSVar6 == (StringEntry *)0x0) {
    if (pSVar5 == (StringEntry *)0x0) {
      bVar15 = true;
      if (newRPath->_M_string_length == 0) {
        uVar12 = 0;
        bVar2 = false;
        bVar16 = true;
      }
      else if (emsg == (string *)0x0) {
        uVar12 = 0;
LAB_001c94b0:
        bVar2 = false;
        bVar16 = false;
      }
      else {
        std::__cxx11::string::assign((char *)emsg);
        uVar12 = 0;
        std::__cxx11::string::append((string *)emsg);
        bVar2 = false;
        bVar16 = false;
      }
      goto LAB_001c94b3;
    }
    local_350 = 1;
  }
  else {
    uVar14 = (ulong)(uVar12 * 8);
    *(StringEntry **)((long)se + uVar14) = pSVar6;
    *(char **)((long)se_name + uVar14) = "RUNPATH";
    local_350 = (ulong)(uVar12 + 1);
  }
  bVar15 = true;
  uVar12 = 0;
  for (uVar14 = 0; local_350 != uVar14; uVar14 = uVar14 + 1) {
    if (uVar12 == 0) {
      pSVar5 = se[uVar14];
LAB_001c91bf:
      sVar7 = cmSystemToolsFindRPath(&pSVar5->Value,oldRPath);
      if (sVar7 == 0xffffffffffffffff) {
        sVar7 = cmSystemToolsFindRPath(&pSVar5->Value,newRPath);
        if (sVar7 == 0xffffffffffffffff) {
          if (emsg == (string *)0x0) {
            bVar2 = false;
            bVar16 = false;
            goto LAB_001c94b3;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar8 = std::operator<<((ostream *)&e,"The current ");
          poVar8 = std::operator<<(poVar8,se_name[uVar14]);
          poVar8 = std::operator<<(poVar8," is:\n");
          poVar8 = std::operator<<(poVar8,"  ");
          poVar8 = std::operator<<(poVar8,(string *)pSVar5);
          poVar8 = std::operator<<(poVar8,"\n");
          poVar8 = std::operator<<(poVar8,"which does not contain:\n");
          poVar8 = std::operator<<(poVar8,"  ");
          poVar8 = std::operator<<(poVar8,(string *)oldRPath);
          poVar8 = std::operator<<(poVar8,"\n");
          std::operator<<(poVar8,"as was expected.");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)emsg,local_2f8);
          std::__cxx11::string::~string(local_2f8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          goto LAB_001c94b0;
        }
        bVar15 = false;
      }
      else {
        uVar1 = pSVar5->Size;
        rp[(int)uVar12].Position = pSVar5->Position;
        rp[(int)uVar12].Size = uVar1;
        std::__cxx11::string::assign((char *)&rp[(int)uVar12].Name);
        std::__cxx11::string::substr((ulong)&e,(ulong)pSVar5);
        this = &rp[(int)uVar12].Value;
        std::__cxx11::string::operator=((string *)this,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::substr((ulong)&e,(ulong)pSVar5);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)&e);
        sVar7 = rp[(int)uVar12].Value._M_string_length;
        bVar15 = (bool)(sVar7 == 0 & bVar15);
        if (rp[(int)uVar12].Size < sVar7 + 1) {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::assign((char *)emsg);
            std::__cxx11::string::append((char *)emsg);
            std::__cxx11::string::append((char *)emsg);
          }
          goto LAB_001c94b0;
        }
        uVar12 = uVar12 + 1;
      }
    }
    else {
      pSVar5 = se[uVar14];
      if (rp[0].Position != pSVar5->Position) goto LAB_001c91bf;
    }
  }
  bVar16 = false;
  bVar2 = true;
LAB_001c94b3:
  cmELF::~cmELF(&elf);
  bVar3 = bVar16;
  if ((bVar2) && (bVar3 = true, uVar12 != 0)) {
    if (bVar15) {
      bVar3 = RemoveRPath(file,emsg,changed);
    }
    else {
      std::ofstream::ofstream(&e,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
      if ((abStack_210[*(long *)(_e + -0x18)] & 5) == 0) {
        uVar13 = 0;
        uVar14 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar14 = uVar13;
        }
        do {
          if (uVar13 == uVar14) {
            bVar11 = 0;
            goto LAB_001c9647;
          }
          plVar9 = (long *)std::ostream::seekp(&e,rp[uVar13].Position,0);
          if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
            if (emsg == (string *)0x0) goto LAB_001c9644;
            std::__cxx11::string::assign((char *)emsg);
            std::__cxx11::string::append((string *)emsg);
            goto LAB_001c9638;
          }
          std::operator<<((ostream *)&e,(string *)&rp[uVar13].Value);
          for (sVar7 = rp[uVar13].Value._M_string_length; sVar7 < rp[uVar13].Size; sVar7 = sVar7 + 1
              ) {
            std::operator<<((ostream *)&e,'\0');
          }
          uVar13 = uVar13 + 1;
        } while ((abStack_210[*(long *)(_e + -0x18)] & 5) == 0);
        if (emsg != (string *)0x0) {
          std::__cxx11::string::assign((char *)emsg);
          std::__cxx11::string::append((string *)emsg);
LAB_001c9638:
          std::__cxx11::string::append((char *)emsg);
        }
      }
      else if (emsg != (string *)0x0) {
        std::__cxx11::string::assign((char *)emsg);
      }
LAB_001c9644:
      bVar11 = 1;
      bVar16 = false;
LAB_001c9647:
      std::ofstream::~ofstream(&e);
      if (changed == (bool *)0x0 || bVar11 != 0) {
        bVar3 = (bool)(bVar16 | bVar11 ^ 1);
      }
      else {
        *changed = true;
      }
    }
  }
  lVar4 = 0x50;
  do {
    cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo
              ((cmSystemToolsRPathInfo *)((long)&rp[0].Position + lVar4));
    lVar4 = lVar4 + -0x50;
  } while (lVar4 != -0x50);
  return bVar3;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath, std::string* emsg,
                                bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      if (newRPath.empty()) {
        // The new rpath is empty and there is no rpath anyway so it is
        // okay.
        return true;
      }
      if (emsg) {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
      }
      return false;
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Make sure the current rpath contains the old rpath.
      std::string::size_type pos =
        cmSystemToolsFindRPath(se[i]->Value, oldRPath);
      if (pos == std::string::npos) {
        // If it contains the new rpath instead then it is okay.
        if (cmSystemToolsFindRPath(se[i]->Value, newRPath) !=
            std::string::npos) {
          remove_rpath = false;
          continue;
        }
        if (emsg) {
          std::ostringstream e;
          /* clang-format off */
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
          /* clang-format on */
          *emsg = e.str();
        }
        return false;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      std::string::size_type prefix_len = pos;

      // If oldRPath was at the end of the file's RPath, and newRPath is empty,
      // we should remove the unnecessary ':' at the end.
      if (newRPath.empty() && pos > 0 && se[i]->Value[pos - 1] == ':' &&
          pos + oldRPath.length() == se[i]->Value.length()) {
        prefix_len--;
      }

      // Construct the new value which preserves the part of the path
      // not being changed.
      rp[rp_count].Value = se[i]->Value.substr(0, prefix_len);
      rp[rp_count].Value += newRPath;
      rp[rp_count].Value += se[i]->Value.substr(pos + oldRPath.length());

      if (!rp[rp_count].Value.empty()) {
        remove_rpath = false;
      }

      // Make sure there is enough room to store the new rpath and at
      // least one null terminator.
      if (rp[rp_count].Size < rp[rp_count].Value.length() + 1) {
        if (emsg) {
          *emsg = "The replacement path is too long for the ";
          *emsg += se_name[i];
          *emsg += " entry.";
        }
        return false;
      }

      // This entry is ready for update.
      ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = "Error seeking to ";
          *emsg += rp[i].Name;
          *emsg += " position.";
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = "Error writing the new ";
          *emsg += rp[i].Name;
          *emsg += " string to the file.";
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}